

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O3

void __thiscall
TCLAP::StdOutput::spacePrint
          (StdOutput *this,ostream *os,string *s,int maxWidth,int indentSpaces,int secondLineOffset)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  ostream *poVar5;
  uint uVar6;
  ulong uVar7;
  size_type sVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  sVar8 = s->_M_string_length;
  uVar3 = (uint)sVar8;
  if (maxWidth < 1 || (int)(uVar3 + indentSpaces) <= maxWidth) {
    if (0 < indentSpaces) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        indentSpaces = indentSpaces + -1;
      } while (indentSpaces != 0);
      sVar8 = s->_M_string_length;
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(s->_M_dataplus)._M_p,sVar8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    return;
  }
  if (0 < (int)uVar3) {
    uVar6 = maxWidth - indentSpaces;
    iVar10 = 0;
    do {
      uVar12 = uVar3 - iVar10;
      uVar13 = uVar12;
      if ((int)uVar6 < (int)uVar12) {
        uVar13 = uVar6;
      }
      if (((int)uVar12 < (int)uVar6) || ((int)uVar13 < 0)) {
LAB_0012711d:
        uVar15 = (ulong)uVar13;
        if ((int)uVar13 < 1) {
          uVar15 = (ulong)uVar6;
        }
      }
      else {
        lVar11 = (long)(int)uVar6 + 1;
        uVar13 = uVar6;
        do {
          cVar1 = (s->_M_dataplus)._M_p[lVar11 + (long)iVar10 + -1];
          if (((cVar1 == ' ') || (cVar1 == ',')) || (cVar1 == '|')) goto LAB_0012711d;
          uVar13 = uVar13 - 1;
          lVar4 = lVar11 + -1;
          bVar2 = 0 < lVar11;
          lVar11 = lVar4;
        } while (lVar4 != 0 && bVar2);
        uVar15 = (ulong)uVar6;
      }
      iVar14 = (int)uVar15;
      if (0 < iVar14) {
        uVar7 = 0;
        do {
          lVar11 = uVar7 + (long)iVar10;
          uVar7 = uVar7 + 1;
          if ((s->_M_dataplus)._M_p[lVar11] == '\n') {
            uVar15 = uVar7 & 0xffffffff;
          }
          iVar14 = (int)uVar15;
        } while ((long)uVar7 < (long)iVar14);
      }
      iVar9 = indentSpaces;
      if (0 < indentSpaces) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      lVar11 = (long)iVar10;
      iVar9 = 0;
      if (iVar10 == 0) {
        iVar9 = secondLineOffset;
      }
      std::__cxx11::string::substr((ulong)&local_50,(ulong)s);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,local_50,local_48);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      uVar6 = uVar6 - iVar9;
      indentSpaces = indentSpaces + iVar9;
      iVar10 = iVar10 + iVar14 + -1;
      do {
        iVar10 = iVar10 + 1;
        if ((long)(ulong)(uVar3 & 0x7fffffff) <= lVar11) break;
        lVar4 = lVar11 + iVar14;
        lVar11 = lVar11 + 1;
      } while ((s->_M_dataplus)._M_p[lVar4] == ' ');
    } while (iVar10 < (int)uVar3);
  }
  return;
}

Assistant:

inline void StdOutput::spacePrint( std::ostream& os, 
						           const std::string& s, 
						           int maxWidth, 
						           int indentSpaces, 
						           int secondLineOffset ) const
{
	int len = static_cast<int>(s.length());

	if ( (len + indentSpaces > maxWidth) && maxWidth > 0 )
		{
			int allowedLen = maxWidth - indentSpaces;
			int start = 0;
			while ( start < len )
				{
					// find the substring length
					// int stringLen = std::min<int>( len - start, allowedLen );
					// doing it this way to support a VisualC++ 2005 bug 
					using namespace std; 
					int stringLen = min<int>( len - start, allowedLen );

					// trim the length so it doesn't end in middle of a word
					if ( stringLen == allowedLen )
						while ( stringLen >= 0 &&
								s[stringLen+start] != ' ' && 
								s[stringLen+start] != ',' &&
								s[stringLen+start] != '|' ) 
							stringLen--;
	
					// ok, the word is longer than the line, so just split 
					// wherever the line ends
					if ( stringLen <= 0 )
						stringLen = allowedLen;

					// check for newlines
					for ( int i = 0; i < stringLen; i++ )
						if ( s[start+i] == '\n' )
							stringLen = i+1;

					// print the indent	
					for ( int i = 0; i < indentSpaces; i++ )
						os << " ";

					if ( start == 0 )
						{
							// handle second line offsets
							indentSpaces += secondLineOffset;

							// adjust allowed len
							allowedLen -= secondLineOffset;
						}

					os << s.substr(start,stringLen) << std::endl;

					// so we don't start a line with a space
					while ( s[stringLen+start] == ' ' && start < len )
						start++;
			
					start += stringLen;
				}
		}
	else
		{
			for ( int i = 0; i < indentSpaces; i++ )
				os << " ";
			os << s << std::endl;
		}
}